

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O0

void __thiscall
avro::
NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::printBasicInfo(NodeImpl<avro::concepts::NoAttribute<avro::Name>,_avro::concepts::SingleAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::NoAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                 *this,ostream *os)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Type TVar4;
  int iVar5;
  undefined4 extraout_var;
  type pNVar6;
  ostream *poVar7;
  ostream *in_RSI;
  Name *in_RDI;
  NoAttribute<avro::Name> *unaff_retaddr;
  int i;
  int count;
  Type in_stack_ffffffffffffffbc;
  ostream *in_stack_ffffffffffffffc0;
  uint local_18;
  Name *n;
  
  n = in_RDI;
  Node::type((Node *)in_RDI);
  operator<<(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  uVar2 = (*(*(_func_int ***)&in_RDI->ns_)[2])();
  if ((uVar2 & 1) != 0) {
    std::operator<<(in_RSI,' ');
    concepts::NoAttribute<avro::Name>::get(unaff_retaddr,(size_t)n);
    operator<<((ostream *)unaff_retaddr,n);
  }
  std::operator<<(in_RSI,'\n');
  iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[4])();
  if (iVar3 == 0) {
    iVar3 = (*(*(_func_int ***)&in_RDI->ns_)[7])();
  }
  for (local_18 = 0; (int)local_18 < iVar3; local_18 = local_18 + 1) {
    TVar4 = Node::type((Node *)in_RDI);
    if (TVar4 != AVRO_NUM_TYPES) {
      iVar5 = (*(*(_func_int ***)&in_RDI->ns_)[5])(in_RDI,(ulong)local_18);
      pNVar6 = boost::shared_ptr<avro::Node>::operator->
                         ((shared_ptr<avro::Node> *)CONCAT44(extraout_var,iVar5));
      (*pNVar6->_vptr_Node[0xe])(pNVar6,in_RSI);
    }
  }
  TVar4 = Node::type((Node *)in_RDI);
  bVar1 = isCompound(TVar4);
  if (bVar1) {
    poVar7 = std::operator<<(in_RSI,"end ");
    Node::type((Node *)in_RDI);
    poVar7 = operator<<(poVar7,in_stack_ffffffffffffffbc);
    std::operator<<(poVar7,'\n');
  }
  return;
}

Assistant:

inline void 
NodeImpl<A,B,C,D>::printBasicInfo(std::ostream &os) const
{
    os << type();
    if(hasName()) {
        os << ' ' << nameAttribute_.get();
    }

    if(D::hasAttribute) {
        os << " " << sizeAttribute_.get();
    }
    os << '\n';
    int count = leaves();
    count = count ? count : names();
    for(int i= 0; i < count; ++i) {
        if( C::hasAttribute ) {
            os << "name " << nameAt(i) << '\n';
        }
        if( type() != AVRO_SYMBOLIC && leafAttributes_.hasAttribute) {
            leafAt(i)->printBasicInfo(os);
        }
    }
    if(isCompound(type())) {
        os << "end " << type() << '\n';
    }
}